

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

_Bool multiply_monster(monster_conflict *mon)

{
  monster_group_info group_info;
  _Bool _Var1;
  wchar_t wVar2;
  monster *mon_00;
  monster_conflict *child;
  monster_group_info info;
  loc_conflict lStack_18;
  _Bool result;
  loc grid;
  monster_conflict *mon_local;
  
  grid = (loc)mon;
  memset(&child,0,0x10);
  _Var1 = monster_is_shape_unique((monster *)grid);
  if ((_Var1) ||
     (wVar2 = scatter_ext(cave,(loc *)&stack0xffffffffffffffe8,L'\x01',*(loc *)((long)grid + 0x24),
                          L'\x01',true,square_isempty), wVar2 < L'\x01')) {
    info.player_race._7_1_ = 0;
  }
  else {
    group_info.player_race = (player_race *)info._0_8_;
    group_info._0_8_ = child;
    info.player_race._7_1_ =
         place_new_monster((chunk *)cave,lStack_18,*(monster_race **)grid,false,false,group_info,
                           '\x14');
    if (((bool)info.player_race._7_1_) &&
       (((mon_00 = square_monster((chunk *)cave,lStack_18), mon_00 != (monster *)0x0 &&
         (_Var1 = monster_is_camouflaged(mon_00), _Var1)) &&
        (_Var1 = monster_is_camouflaged((monster *)grid), !_Var1)))) {
      become_aware((chunk *)cave,mon_00);
    }
  }
  return (_Bool)(info.player_race._7_1_ & 1);
}

Assistant:

bool multiply_monster(const struct monster *mon)
{
	struct loc grid;
	bool result;
	struct monster_group_info info = { 0, 0, 0 };

	/*
	 * Pick an empty location except for uniques:  they can never
	 * multiply (need a check here as the ones in place_new_monster()
	 * are not sufficient for a unique shape of a shapechanged monster
	 * since it may have zero for cur_num in the race structure for the
	 * shape).
	 */
	if (!monster_is_shape_unique(mon) && scatter_ext(cave, &grid,
			1, mon->grid, 1, true, square_isempty) > 0) {
		/* Create a new monster (awake, no groups) */
		result = place_new_monster(cave, grid, mon->race, false, false,
			info, ORIGIN_DROP_BREED);
		/*
		 * Fix so multiplying a revealed camouflaged monster creates
		 * another revealed camouflaged monster.
		 */
		if (result) {
			struct monster *child = square_monster(cave, grid);

			if (child && monster_is_camouflaged(child)
					&& !monster_is_camouflaged(mon)) {
				become_aware(cave, child);
			}
		}
	} else {
		result = false;
	}

	/* Result */
	return (result);
}